

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O0

void __thiscall
cmExportLibraryDependenciesCommand::ConstFinalPass(cmExportLibraryDependenciesCommand *this)

{
  size_t *psVar1;
  cmTargetLinkLibraryType cVar2;
  byte bVar3;
  bool bVar4;
  TargetType TVar5;
  cmGeneratedFileStream *this_00;
  pointer this_01;
  cmake *this_02;
  cmGlobalGenerator *this_03;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *this_04;
  reference ppcVar6;
  cmTargets *this_05;
  reference pvVar7;
  string *psVar8;
  LinkLibraryVectorType *this_06;
  reference ppVar9;
  cmTarget *pcVar10;
  char *pcVar11;
  mapped_type *pmVar12;
  ostream *poVar13;
  ulong uVar14;
  reference ppVar15;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i_2;
  iterator __end1_3;
  iterator __begin1_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i_1;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  char *vertest;
  string *ltEntry;
  string local_288;
  char *local_268;
  char *outname;
  cmTarget *libtgt;
  string lib;
  string ltValue;
  string ltVar;
  LibraryID *li;
  const_iterator __end3;
  const_iterator __begin3;
  LinkLibraryVectorType *__range3;
  LinkLibraryVectorType *libs;
  string valueNew;
  string valueOld;
  string targetEntry;
  cmTarget *target;
  value_type *tgt;
  const_iterator __end2;
  const_iterator __begin2;
  cmTargets *__range2;
  cmTargets *tgts;
  cmMakefile *local;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libTypes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsNew;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsOld;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *locals;
  cmGlobalGenerator *global;
  cmake *cm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  type local_50;
  ostream *fout;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> ap;
  undefined8 local_30;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  local_28;
  undefined4 local_1c;
  openmode openmodeApp;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  foutPtr;
  cmExportLibraryDependenciesCommand *this_local;
  
  foutPtr._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>,_true,_true>
          )this;
  std::unique_ptr<std::ofstream,std::default_delete<std::ofstream>>::
  unique_ptr<std::default_delete<std::ofstream>,void>
            ((unique_ptr<std::ofstream,std::default_delete<std::ofstream>> *)
             &stack0xffffffffffffffe8);
  if ((this->Append & 1U) == 0) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&this->Filename,true,None);
    std::unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>>::
    unique_ptr<std::default_delete<cmGeneratedFileStream>,void>
              ((unique_ptr<cmGeneratedFileStream,std::default_delete<cmGeneratedFileStream>> *)&fout
               ,this_00);
    this_01 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
              operator->((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                          *)&fout);
    cmGeneratedFileStream::SetCopyIfDifferent(this_01,true);
    std::unique_ptr<std::ofstream,std::default_delete<std::ofstream>>::operator=
              ((unique_ptr<std::ofstream,std::default_delete<std::ofstream>> *)
               &stack0xffffffffffffffe8,
               (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               &fout);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              ((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               &fout);
  }
  else {
    local_1c = 1;
    local_30 = std::__cxx11::string::c_str();
    std::make_unique<std::ofstream,char_const*,std::_Ios_Openmode_const&>
              ((char **)&local_28,(_Ios_Openmode *)&local_30);
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::operator=((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)&stack0xffffffffffffffe8,&local_28);
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::~unique_ptr(&local_28);
  }
  local_50 = std::
             unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                          *)&stack0xffffffffffffffe8);
  bVar3 = std::ios::operator!((ios *)((long)&(local_50->
                                             super_basic_ostream<char,_std::char_traits<char>_>).
                                             _vptr_basic_ostream +
                                     (long)(local_50->
                                           super_basic_ostream<char,_std::char_traits<char>_>).
                                           _vptr_basic_ostream[-3]));
  if ((bVar3 & 1) == 0) {
    this_02 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    this_03 = cmake::GetGlobalGenerator(this_02);
    this_04 = cmGlobalGenerator::GetMakefiles(this_03);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&__range1);
    __end1 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(this_04);
    local = (cmMakefile *)std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end(this_04);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                                       *)&local), bVar4) {
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&__end1);
      this_05 = cmMakefile::GetTargets_abi_cxx11_(*ppcVar6);
      __end2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
               ::begin(this_05);
      tgt = (value_type *)
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
            ::end(this_05);
      while (bVar4 = std::__detail::operator!=
                               (&__end2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                                  *)&tgt), bVar4) {
        pvVar7 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator*(&__end2);
        pcVar10 = &pvVar7->second;
        TVar5 = cmTarget::GetType(pcVar10);
        if ((0 < (int)TVar5) && (TVar5 = cmTarget::GetType(pcVar10), (int)TVar5 < 4)) {
          psVar8 = cmTarget::GetName_abi_cxx11_(pcVar10);
          std::__cxx11::string::string
                    ((string *)(valueOld.field_2._M_local_buf + 8),(string *)psVar8);
          std::__cxx11::string::operator+=
                    ((string *)(valueOld.field_2._M_local_buf + 8),"_LIB_DEPENDS");
          std::__cxx11::string::string((string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&libs);
          this_06 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(pcVar10);
          __end3 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                   ::begin(this_06);
          li = (LibraryID *)
               std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
               ::end(this_06);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                                             *)&li), bVar4) {
            ppVar9 = __gnu_cxx::
                     __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                     ::operator*(&__end3);
            std::__cxx11::string::string
                      ((string *)(ltValue.field_2._M_local_buf + 8),(string *)ppVar9);
            std::__cxx11::string::operator+=
                      ((string *)(ltValue.field_2._M_local_buf + 8),"_LINK_TYPE");
            std::__cxx11::string::string((string *)(lib.field_2._M_local_buf + 8));
            cVar2 = ppVar9->second;
            if (cVar2 == GENERAL_LibraryType) {
              std::__cxx11::string::operator+=((string *)&libs,"general;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"general");
            }
            else if (cVar2 == DEBUG_LibraryType) {
              std::__cxx11::string::operator+=((string *)&libs,"debug;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"debug");
            }
            else if (cVar2 == OPTIMIZED_LibraryType) {
              std::__cxx11::string::operator+=((string *)&libs,"optimized;");
              std::__cxx11::string::operator=((string *)(lib.field_2._M_local_buf + 8),"optimized");
            }
            std::__cxx11::string::string((string *)&libtgt,(string *)ppVar9);
            pcVar10 = cmGlobalGenerator::FindTarget(this_03,(string *)&libtgt,false);
            outname = &pcVar10->IsGeneratorProvided;
            if (pcVar10 != (cmTarget *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_288,"OUTPUT_NAME",(allocator<char> *)((long)&ltEntry + 7))
              ;
              pcVar11 = cmTarget::GetProperty(pcVar10,&local_288);
              std::__cxx11::string::~string((string *)&local_288);
              std::allocator<char>::~allocator((allocator<char> *)((long)&ltEntry + 7));
              local_268 = pcVar11;
              if (pcVar11 != (char *)0x0) {
                std::__cxx11::string::operator=((string *)&libtgt,pcVar11);
              }
            }
            std::__cxx11::string::operator+=
                      ((string *)(valueNew.field_2._M_local_buf + 8),(string *)&libtgt);
            std::__cxx11::string::operator+=((string *)(valueNew.field_2._M_local_buf + 8),";");
            std::__cxx11::string::operator+=((string *)&libs,(string *)&libtgt);
            std::__cxx11::string::operator+=((string *)&libs,";");
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&__range1,(key_type *)((long)&ltValue.field_2 + 8));
            uVar14 = std::__cxx11::string::empty();
            if ((uVar14 & 1) == 0) {
              bVar4 = std::operator!=(pmVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)((long)&lib.field_2 + 8));
              if (bVar4) {
                std::__cxx11::string::operator=((string *)pmVar12,"general");
              }
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)pmVar12,(string *)(lib.field_2._M_local_buf + 8));
            }
            std::__cxx11::string::~string((string *)&libtgt);
            std::__cxx11::string::~string((string *)(lib.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(ltValue.field_2._M_local_buf + 8));
            __gnu_cxx::
            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
            ::operator++(&__end3);
          }
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (key_type *)((long)&valueOld.field_2 + 8));
          std::__cxx11::string::operator=((string *)pmVar12,(string *)&libs);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (key_type *)((long)&valueOld.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)pmVar12,(string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&libs);
          std::__cxx11::string::~string((string *)(valueNew.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(valueOld.field_2._M_local_buf + 8));
        }
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
        ::operator++(&__end2);
      }
      __gnu_cxx::
      __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
      ::operator++(&__end1);
    }
    std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,
                    "# Generated by CMake\n\n");
    poVar13 = std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,"if(");
    poVar13 = std::operator<<(poVar13,
                              "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4");
    std::operator<<(poVar13,")\n");
    std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,
                    "  # Information for CMake 2.6 and above.\n");
    psVar1 = &libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)psVar1);
    i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)psVar1);
    while (bVar4 = std::operator!=(&__end1_1,(_Self *)&i), bVar4) {
      ppVar15 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1_1);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) == 0) {
        poVar13 = std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "  set(\"");
        poVar13 = std::operator<<(poVar13,(string *)ppVar15);
        poVar13 = std::operator<<(poVar13,"\" \"");
        poVar13 = std::operator<<(poVar13,(string *)&ppVar15->second);
        std::operator<<(poVar13,"\")\n");
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1_1);
    }
    std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,"else()\n");
    std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,
                    "  # Information for CMake 2.4 and lower.\n");
    psVar1 = &libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)psVar1);
    i_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)psVar1);
    while (bVar4 = std::operator!=(&__end1_2,(_Self *)&i_1), bVar4) {
      ppVar15 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1_2);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) == 0) {
        poVar13 = std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "  set(\"");
        poVar13 = std::operator<<(poVar13,(string *)ppVar15);
        poVar13 = std::operator<<(poVar13,"\" \"");
        poVar13 = std::operator<<(poVar13,(string *)&ppVar15->second);
        std::operator<<(poVar13,"\")\n");
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1_2);
    }
    __end1_3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range1);
    i_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range1);
    while (bVar4 = std::operator!=(&__end1_3,(_Self *)&i_2), bVar4) {
      ppVar15 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1_3);
      bVar4 = std::operator!=(&ppVar15->second,"general");
      if (bVar4) {
        poVar13 = std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "  set(\"");
        poVar13 = std::operator<<(poVar13,(string *)ppVar15);
        poVar13 = std::operator<<(poVar13,"\" \"");
        poVar13 = std::operator<<(poVar13,(string *)&ppVar15->second);
        std::operator<<(poVar13,"\")\n");
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1_3);
    }
    std::operator<<(&local_50->super_basic_ostream<char,_std::char_traits<char>_>,"endif()\n");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__range1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    std::operator+(&local_70,"Error Writing ",&this->Filename);
    cmSystemTools::Error(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cmSystemTools::ReportLastSystemError("");
  }
  std::
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void cmExportLibraryDependenciesCommand::ConstFinalPass() const
{
  // Use copy-if-different if not appending.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (this->Append) {
    const auto openmodeApp = std::ios::app;
    foutPtr =
      cm::make_unique<cmsys::ofstream>(this->Filename.c_str(), openmodeApp);
  } else {
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->Filename, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  std::ostream& fout = *foutPtr;

  if (!fout) {
    cmSystemTools::Error("Error Writing " + this->Filename);
    cmSystemTools::ReportLastSystemError("");
    return;
  }

  // Collect dependency information about all library targets built in
  // the project.
  cmake* cm = this->Makefile->GetCMakeInstance();
  cmGlobalGenerator* global = cm->GetGlobalGenerator();
  const std::vector<cmMakefile*>& locals = global->GetMakefiles();
  std::map<std::string, std::string> libDepsOld;
  std::map<std::string, std::string> libDepsNew;
  std::map<std::string, std::string> libTypes;
  for (cmMakefile* local : locals) {
    const cmTargets& tgts = local->GetTargets();
    for (auto const& tgt : tgts) {
      // Get the current target.
      cmTarget const& target = tgt.second;

      // Skip non-library targets.
      if (target.GetType() < cmStateEnums::STATIC_LIBRARY ||
          target.GetType() > cmStateEnums::MODULE_LIBRARY) {
        continue;
      }

      // Construct the dependency variable name.
      std::string targetEntry = target.GetName();
      targetEntry += "_LIB_DEPENDS";

      // Construct the dependency variable value with the direct link
      // dependencies.
      std::string valueOld;
      std::string valueNew;
      cmTarget::LinkLibraryVectorType const& libs =
        target.GetOriginalLinkLibraries();
      for (cmTarget::LibraryID const& li : libs) {
        std::string ltVar = li.first;
        ltVar += "_LINK_TYPE";
        std::string ltValue;
        switch (li.second) {
          case GENERAL_LibraryType:
            valueNew += "general;";
            ltValue = "general";
            break;
          case DEBUG_LibraryType:
            valueNew += "debug;";
            ltValue = "debug";
            break;
          case OPTIMIZED_LibraryType:
            valueNew += "optimized;";
            ltValue = "optimized";
            break;
        }
        std::string lib = li.first;
        if (cmTarget* libtgt = global->FindTarget(lib)) {
          // Handle simple output name changes.  This command is
          // deprecated so we do not support full target name
          // translation (which requires per-configuration info).
          if (const char* outname = libtgt->GetProperty("OUTPUT_NAME")) {
            lib = outname;
          }
        }
        valueOld += lib;
        valueOld += ";";
        valueNew += lib;
        valueNew += ";";

        std::string& ltEntry = libTypes[ltVar];
        if (ltEntry.empty()) {
          ltEntry = ltValue;
        } else if (ltEntry != ltValue) {
          ltEntry = "general";
        }
      }
      libDepsNew[targetEntry] = valueNew;
      libDepsOld[targetEntry] = valueOld;
    }
  }

  // Generate dependency information for both old and new style CMake
  // versions.
  const char* vertest =
    "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4";
  fout << "# Generated by CMake\n\n";
  fout << "if(" << vertest << ")\n";
  fout << "  # Information for CMake 2.6 and above.\n";
  for (auto const& i : libDepsNew) {
    if (!i.second.empty()) {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  fout << "else()\n";
  fout << "  # Information for CMake 2.4 and lower.\n";
  for (auto const& i : libDepsOld) {
    if (!i.second.empty()) {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  for (auto const& i : libTypes) {
    if (i.second != "general") {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  fout << "endif()\n";
}